

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_range_benchmark.c
# Opt level: O2

_Bool range_intersect(void *base,testvalue_t tv)

{
  undefined1 uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  uVar1 = roaring_bitmap_intersect_with_range(tv.bitmap,(ulong)tv.range[0],(ulong)tv.range[1]);
  if (tv.expected != (_Bool)uVar1) {
    pcVar3 = "\'false\'";
    pcVar4 = "\'false\'";
    if (tv.expected != false) {
      pcVar4 = "\'true\'";
    }
    if ((bool)uVar1) {
      pcVar3 = "\'true\'";
    }
    iVar2 = printf("ERROR: expected %s but got %s for intersection of bitmap [%u,%u,%u] with range [%u,%u]\n"
                   ,pcVar4,pcVar3,(ulong)tv.bitmap_range[0],(ulong)tv.bitmap_range[1],
                   (ulong)tv.bitmap_range[2],(ulong)tv.range[0],(ulong)tv.range[1]);
    uVar1 = (undefined1)iVar2;
  }
  return (_Bool)uVar1;
}

Assistant:

static bool range_intersect(void *base, testvalue_t tv) {
    (void)base;
    bool res = roaring_bitmap_intersect_with_range(tv.bitmap, tv.range[0],
                                                   tv.range[1]);
    if (paranoid && res != tv.expected) {
        printf(
            "ERROR: expected %s but got %s for intersection of bitmap "
            "[%u,%u,%u] with range [%u,%u]\n",
            tv.expected ? "'true'" : "'false'", res ? "'true'" : "'false'",
            tv.bitmap_range[0], tv.bitmap_range[1], tv.bitmap_range[2],
            tv.range[0], tv.range[1]);
    }
    return res;
}